

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
* active_var(map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             *__return_storage_ptr__,
            map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
            *nodes)

{
  _Rb_tree_node_base *p_Var1;
  char cVar2;
  _Rb_tree_color n;
  key_type *__k;
  _func_int **pp_Var3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  int iVar7;
  BasicBlock *pBVar8;
  _Rb_tree_header *p_Var9;
  _Rb_tree_node_base *p_Var10;
  iterator iVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  long lVar13;
  __shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2> *p_Var14;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar15;
  __shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2> *p_Var16;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar17;
  mapped_type *pmVar18;
  iterator iVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  ostream *poVar22;
  _Base_ptr p_Var23;
  _Self __tmp;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *this;
  _Self __tmp_2;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  _Self __tmp_3;
  ulong uVar27;
  shared_ptr<mir::inst::OpInst> in_1;
  _Self __tmp_1;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  global;
  shared_ptr<mir::inst::Inst> ins;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> v;
  vector<int,_std::allocator<int>_> visit;
  VarId s;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  VarId local_800;
  VarId local_7f0;
  VarId local_7e0;
  VarId local_7d0;
  VarId local_7c0;
  VarId local_7b0;
  VarId local_7a0;
  VarId local_790;
  VarId local_780;
  VarId local_770;
  VarId local_760;
  VarId local_750;
  VarId local_740;
  VarId local_730;
  VarId local_720;
  VarId local_710;
  VarId local_700;
  VarId local_6f0;
  VarId local_6e0;
  VarId local_6d0;
  VarId local_6c0;
  VarId local_6b0;
  VarId local_6a0;
  VarId local_690;
  VarId local_680;
  VarId local_670;
  VarId local_660;
  VarId local_650;
  VarId local_640;
  VarId local_630;
  VarId local_620;
  VarId local_610;
  VarId local_600;
  VarId local_5f0;
  VarId local_5e0;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  def;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_5a0;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_588;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_570;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_558;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_540;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_528;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_510;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4f8;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4e0;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4c8;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_4b0;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_498;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_480;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_468;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_450;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_438;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  out;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  in;
  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  use;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_390;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_378;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_360;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_348;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_330;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_318;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_300;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_2e8;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_2d0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_2b8;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_288;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_270;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_258;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_240;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_228;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_1f8;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_1c8;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_198;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_168;
  _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_138;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_108;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_f0;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_d8;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_c0;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_a8;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_90;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_78;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_60;
  _Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_48;
  
  def._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &def._M_t._M_impl.super__Rb_tree_header._M_header;
  def._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  def._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  def._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  use._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &use._M_t._M_impl.super__Rb_tree_header._M_header;
  use._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  use._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  use._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  in._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &in._M_t._M_impl.super__Rb_tree_header._M_header;
  in._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  in._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  in._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  out._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &out._M_t._M_impl.super__Rb_tree_header._M_header;
  out._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  out._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  out._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  def._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       def._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  out._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       out._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  in._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       in._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  use._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       use._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::_Rb_tree(&local_228,&nodes->_M_t);
  pBVar8 = find_entry((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                       *)&local_228);
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::~_Rb_tree(&local_228);
  p_Var9 = &(nodes->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var10 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != p_Var9;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var1 = p_Var10 + 1;
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::
    pair<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_&,_true>
              ((pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *
               )&q,(int *)p_Var1,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               &v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>);
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
    ::
    _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
              ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                *)&def,(pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                        *)&q);
    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
              ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               &q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_map_size);
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::
    pair<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_&,_true>
              ((pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *
               )&q,(int *)p_Var1,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               &v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>);
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
    ::
    _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
              ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                *)&use,(pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                        *)&q);
    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
              ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               &q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_map_size);
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::
    pair<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_&,_true>
              ((pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *
               )&q,(int *)p_Var1,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               &v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>);
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
    ::
    _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
              ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                *)&in,(pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                       *)&q);
    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
              ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               &q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_map_size);
    std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>::
    pair<std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_&,_true>
              ((pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_> *
               )&q,(int *)p_Var1,
               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               &v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>);
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
    ::
    _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
              ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                *)&out,(pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                        *)&q);
    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
              ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
               &q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_map_size);
    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
              (&v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>);
  }
  visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>(&q);
  std::vector<int,_std::allocator<int>_>::push_back(&visit,&pBVar8->id);
  std::deque<int,_std::allocator<int>_>::push_back(&q.c,&pBVar8->id);
  do {
    if (q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
        _M_cur == q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_cur) {
      do {
        p_Var10 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar6 = false;
        while( true ) {
          if ((_Rb_tree_header *)p_Var10 == p_Var9) break;
          pBVar8 = (BasicBlock *)p_Var10[1]._M_parent;
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::_Rb_tree(&local_138,&in._M_t);
          calcu_out(&v,pBVar8,
                    (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                     *)&local_138);
          p_Var1 = p_Var10 + 1;
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::~_Rb_tree(&local_138);
          pmVar18 = std::
                    map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[]((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                                  *)&out._M_t,(key_type *)p_Var1);
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=(pmVar18,&v);
          n = p_Var1->_M_color;
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::_Rb_tree(&local_1c8,&use._M_t);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::_Rb_tree(&local_1f8,&out._M_t);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::_Rb_tree(&local_168,&def._M_t);
          calcu_in((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global,n,
                   (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)&local_1c8,
                   (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)&local_1f8,
                   (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)&local_168);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::~_Rb_tree(&local_168);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::~_Rb_tree(&local_1f8);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::~_Rb_tree(&local_1c8);
          iVar19 = std::
                   _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                   ::find(&in._M_t,(key_type *)p_Var1);
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_240,
                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global);
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_258,
                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                     &iVar19._M_node[1]._M_parent);
          vectors_difference((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&ins,
                             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             &local_240,
                             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             &local_258);
          _Var5 = ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          peVar4 = ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                    ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&ins);
          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                    (&local_258);
          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                    (&local_240);
          if ((element_type *)_Var5._M_pi != peVar4) {
            pmVar18 = std::
                      map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                      ::operator[](&in,(key_type *)p_Var1);
            bVar6 = true;
            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                      (pmVar18,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &global);
          }
          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                    ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global);
          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                    (&v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>);
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        }
      } while (bVar6);
      global._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &global._M_t._M_impl.super__Rb_tree_header._M_header;
      global._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           global._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      global._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      global._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      global._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           global._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var20 = def._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var20 != &def._M_t._M_impl.super__Rb_tree_header;
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
        iVar19 = std::
                 _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                 ::find(&out._M_t,(key_type *)(p_Var20 + 1));
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_270,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   &p_Var20[1]._M_parent);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_288,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   &iVar19._M_node[1]._M_parent);
        vectors_intersection
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&ins,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_270,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_288);
        v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(v.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,p_Var20[1]._M_color);
        v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        _Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
        ::
        _M_insert_unique<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>
                  ((_Rb_tree<int,std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>>>
                    *)&global,
                   (pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                    *)&v);
        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                  ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   &v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                  ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&ins);
        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                  (&local_288);
        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                  (&local_270);
      }
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      p_Var9 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var9->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var9->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      for (p_Var20 = global._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var20 != &global._M_t._M_impl.super__Rb_tree_header;
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
        p_Var21 = p_Var20[1]._M_parent;
        p_Var23 = p_Var20[1]._M_left;
        if (p_Var23 != p_Var21) {
          lVar24 = 0;
          for (uVar26 = 0; uVar26 < (ulong)((long)p_Var23 - (long)p_Var21 >> 4); uVar26 = uVar26 + 1
              ) {
            local_800.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
            local_800.id = *(uint32_t *)((long)&p_Var21->_M_parent + lVar24);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::_Rb_tree(&local_2b8,&def._M_t);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::_Rb_tree(&local_198,&use._M_t);
            blockHasVar((set<int,_std::less<int>,_std::allocator<int>_> *)&ins,&local_800,
                        (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                         *)&local_2b8,
                        (map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                         *)&local_198);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::~_Rb_tree(&local_198);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::~_Rb_tree(&local_2b8);
            std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
            ::pair<mir::inst::VarId_&,_std::set<int,_std::less<int>,_std::allocator<int>_>_&,_true>
                      ((pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
                        *)&v,(VarId *)((long)&(p_Var20[1]._M_parent)->_M_color + lVar24),
                       (set<int,_std::less<int>,_std::allocator<int>_> *)&ins);
            std::
            _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>>
            ::
            _M_insert_unique<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>
                      ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                        *)__return_storage_ptr__,
                       (pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
                        *)&v);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)&v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)&ins);
            p_Var21 = p_Var20[1]._M_parent;
            p_Var23 = p_Var20[1]._M_left;
            lVar24 = lVar24 + 0x10;
          }
        }
      }
      poVar22 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar22 = std::operator<<(poVar22,"*** desplay blocks ***");
      std::endl<char,std::char_traits<char>>(poVar22);
      for (p_Var20 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var20 != p_Var9;
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
        (*(code *)**(undefined8 **)(p_Var20 + 1))(p_Var20 + 1,&std::cout);
        for (p_Var10 = p_Var20[2]._M_parent; p_Var10 != (_Rb_tree_node_base *)&p_Var20[1]._M_right;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          poVar22 = std::operator<<((ostream *)&std::cout," ");
          std::ostream::operator<<(poVar22,p_Var10[1]._M_color);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&global._M_t);
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)&q);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&visit.super__Vector_base<int,_std::allocator<int>_>);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&out._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&in._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&use._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::~_Rb_tree(&def._M_t);
      return __return_storage_ptr__;
    }
    iVar11 = std::
             _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
             ::find(&nodes->_M_t,
                    q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                    _M_start._M_cur);
    p_Var20 = iVar11._M_node[1]._M_parent;
    std::deque<int,_std::allocator<int>_>::pop_front(&q.c);
    for (uVar26 = 0; uVar26 < (ulong)((long)p_Var20[1]._M_parent - *(long *)(p_Var20 + 1) >> 3);
        uVar26 = uVar26 + 1) {
      _Var12 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                         (visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,
                          *(undefined8 *)(*(long *)(p_Var20 + 1) + uVar26 * 8));
      if (_Var12._M_current ==
          visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        global._M_t._M_impl._0_8_ = 0;
        global._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        global._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        global._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        uVar27 = 0;
        while( true ) {
          __k = *(key_type **)(*(long *)(p_Var20 + 1) + uVar26 * 8);
          lVar24 = *(long *)(__k + 2);
          if ((ulong)((*(long *)(__k + 4) - lVar24) / 0x18) <= uVar27) break;
          lVar13 = uVar27 * 0x18;
          cVar2 = *(char *)(lVar24 + 0x10 + lVar13);
          if (cVar2 == '\x01') {
            p_Var16 = &std::
                       get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                                 ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                   *)(lVar24 + lVar13))->
                       super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2> *)&ins,
                       p_Var16);
            if ((*(int *)&((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->dest).super_Displayable._vptr_Displayable - 1U < 2) &&
               (*(char *)&ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          [1].dest.super_Displayable._vptr_Displayable == '\x01')) {
              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                        ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_5a0,
                         (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global);
              local_7e0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
              local_7e0.id = *(uint32_t *)
                              &ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr[1].super_Displayable._vptr_Displayable;
              bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &local_5a0,&local_7e0);
              if (bVar6) {
                std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                ~_Vector_base(&local_5a0);
              }
              else {
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_108
                           ,&v);
                local_7f0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                local_7f0.id = *(uint32_t *)
                                &ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr[1].super_Displayable._vptr_Displayable;
                bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &local_108,&local_7f0);
                std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                ~_Vector_base(&local_108);
                std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                ~_Vector_base(&local_5a0);
                if (!bVar6) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global,
                             (value_type *)
                             &((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->dest).id);
                }
              }
            }
LAB_00174650:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          else if (cVar2 == '\0') {
            p_Var14 = &std::
                       get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                                 ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                   *)(lVar24 + lVar13))->
                       super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>,p_Var14)
            ;
            iVar7 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_Displayable)._vptr_Displayable[1])();
            if (iVar7 == 0) {
              std::static_pointer_cast<mir::inst::AssignInst,mir::inst::Inst>
                        ((shared_ptr<mir::inst::Inst> *)&in_1);
              if (((in_1.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  lhs).field_0x18 == '\x01') {
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_438
                           ,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global);
                pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)
                                     &((in_1.
                                        super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->lhs).field_0x8);
                local_5e0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                local_5e0.id = pvVar15->id;
                bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &local_438,&local_5e0);
                if (bVar6) {
                  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                  ~_Vector_base(&local_438);
                }
                else {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             &local_2d0,&v);
                  pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)
                                       &((in_1.
                                          super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->lhs).field_0x8);
                  local_5f0.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001d90d0;
                  local_5f0.id = pvVar15->id;
                  bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_2d0,&local_5f0);
                  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                  ~_Vector_base(&local_2d0);
                  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                  ~_Vector_base(&local_438);
                  if (!bVar6) {
                    pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)
                                         &((in_1.
                                            super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->lhs).field_0x8);
                    s.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                    s.id = pvVar15->id;
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &global,&s);
                  }
                }
              }
              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                        ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_450,
                         (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global);
              local_600.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
              local_600.id = ((in_1.
                               super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_Inst).dest.id;
              bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &local_450,&local_600);
              if (bVar6) {
                std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                ~_Vector_base(&local_450);
              }
              else {
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_48,
                           &v);
                local_610.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                local_610.id = ((in_1.
                                 super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->super_Inst).dest.id;
                bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &local_48,&local_610);
                std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                ~_Vector_base(&local_48);
                std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                ~_Vector_base(&local_450);
                if (!bVar6) {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                            (&v,&((in_1.
                                   super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_Inst).dest);
                }
              }
            }
            else {
              iVar7 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->super_Displayable)._vptr_Displayable[1])();
              if (iVar7 == 1) {
                std::static_pointer_cast<mir::inst::OpInst,mir::inst::Inst>
                          ((shared_ptr<mir::inst::Inst> *)&in_1);
                if (((in_1.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->lhs).field_0x18 == '\x01') {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             &local_468,
                             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global)
                  ;
                  pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)
                                       &((in_1.
                                          super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->lhs).field_0x8);
                  local_620.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001d90d0;
                  local_620.id = pvVar15->id;
                  bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_468,&local_620);
                  if (bVar6) {
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_468);
                  }
                  else {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &local_2e8,&v);
                    pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)
                                         &((in_1.
                                            super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->lhs).field_0x8);
                    local_630.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001d90d0;
                    local_630.id = pvVar15->id;
                    bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &local_2e8,&local_630);
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_2e8);
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_468);
                    if (!bVar6) {
                      pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)
                                           &((in_1.
                                              super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->lhs).field_0x8);
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &global,pvVar15);
                    }
                  }
                }
                if (((in_1.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->rhs).field_0x18 == '\x01') {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             &local_480,
                             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global)
                  ;
                  pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)
                                       &((in_1.
                                          super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->rhs).field_0x8);
                  local_640.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001d90d0;
                  local_640.id = pvVar15->id;
                  bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_480,&local_640);
                  if (bVar6) {
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_480);
                  }
                  else {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &local_300,&v);
                    pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)
                                         &((in_1.
                                            super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->rhs).field_0x8);
                    local_650.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001d90d0;
                    local_650.id = pvVar15->id;
                    bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &local_300,&local_650);
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_300);
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_480);
                    if (!bVar6) {
                      pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)
                                           &((in_1.
                                              super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->rhs).field_0x8);
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &global,pvVar15);
                    }
                  }
                }
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_498
                           ,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global);
                local_660.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
                local_660.id = ((in_1.
                                 super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->super_Inst).dest.id;
                bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &local_498,&local_660);
                if (bVar6) {
                  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                  ~_Vector_base(&local_498);
                }
                else {
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                             &local_60,&v);
                  local_670.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001d90d0;
                  local_670.id = ((in_1.
                                   super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_Inst).dest.id;
                  bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_60,&local_670);
                  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                  ~_Vector_base(&local_60);
                  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                  ~_Vector_base(&local_498);
                  if (!bVar6) {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                              (&v,&((in_1.
                                     super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_Inst).dest);
                  }
                }
              }
              else {
                iVar7 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Displayable)._vptr_Displayable[1])();
                if (iVar7 == 6) {
                  std::static_pointer_cast<mir::inst::CallInst,mir::inst::Inst>
                            ((shared_ptr<mir::inst::Inst> *)&in_1);
                  lVar24 = 0x18;
                  for (uVar25 = 0;
                      pp_Var3 = ((in_1.
                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->rhs).super_Displayable._vptr_Displayable,
                      uVar25 < (ulong)(*(long *)&((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->rhs).field_0x8 - (long)pp_Var3 >> 5);
                      uVar25 = uVar25 + 1) {
                    if (*(char *)((long)pp_Var3 + lVar24) == '\x01') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &local_4b0,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &global);
                      pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)
                                           ((long)((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->rhs).super_Displayable._vptr_Displayable
                                           + lVar24 + -0x10));
                      local_680.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001d90d0;
                      local_680.id = pvVar15->id;
                      bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)&local_4b0,&local_680);
                      if (bVar6) {
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_4b0);
                      }
                      else {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_318,&v);
                        pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)
                                             ((long)((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->rhs).super_Displayable._vptr_Displayable
                                             + lVar24 + -0x10));
                        local_690.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_690.id = pvVar15->id;
                        bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)&local_318,&local_690);
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_318);
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_4b0);
                        if (!bVar6) {
                          pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                              ((variant<int,_mir::inst::VarId> *)
                                               ((long)((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->rhs).super_Displayable._vptr_Displayable
                                               + lVar24 + -0x10));
                          s.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001d90d0;
                          s.id = pvVar15->id;
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    &global,&s);
                        }
                      }
                    }
                    lVar24 = lVar24 + 0x20;
                  }
                  this = &local_330;
                  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)this,
                             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global)
                  ;
                  local_6a0.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001d90d0;
                  local_6a0.id = ((in_1.
                                   super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_Inst).dest.id;
                  bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   this,&local_6a0);
                  if (bVar6) {
LAB_00174641:
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(this);
                  }
                  else {
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &local_78,&v);
                    local_6b0.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001d90d0;
                    local_6b0.id = ((in_1.
                                     super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_Inst).dest.id;
                    bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &local_78,&local_6b0);
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_78);
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_330);
                    if (!bVar6) {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                                (&v,&((in_1.
                                       super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_Inst).dest);
                    }
                  }
                }
                else {
                  iVar7 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Displayable)._vptr_Displayable[1])();
                  if (iVar7 == 2) {
                    std::static_pointer_cast<mir::inst::RefInst,mir::inst::Inst>
                              ((shared_ptr<mir::inst::Inst> *)&in_1);
                    if (*(char *)&((in_1.
                                    super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->rhs).super_Displayable._vptr_Displayable == '\0') {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &local_4c8,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &global);
                      pvVar17 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                          ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&(in_1.
                                                super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->lhs);
                      local_6c0.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001d90d0;
                      local_6c0.id = pvVar17->id;
                      bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)&local_4c8,&local_6c0);
                      if (bVar6) {
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_4c8);
                      }
                      else {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_348,&v);
                        pvVar17 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                            ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&(in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->lhs);
                        local_6d0.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_6d0.id = pvVar17->id;
                        bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)&local_348,&local_6d0);
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_348);
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_4c8);
                        if (!bVar6) {
                          pvVar17 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                              ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&(in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->lhs);
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                    &global,pvVar17);
                        }
                      }
                    }
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &local_4e0,
                               (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &global);
                    local_6e0.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001d90d0;
                    local_6e0.id = ((in_1.
                                     super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_Inst).dest.id;
                    this = &local_4e0;
                    bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     this,&local_6e0);
                    if (bVar6) goto LAB_00174641;
                    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                               &local_90,&v);
                    local_6f0.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001d90d0;
                    local_6f0.id = ((in_1.
                                     super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_Inst).dest.id;
                    bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &local_90,&local_6f0);
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_90);
                    std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                    ~_Vector_base(&local_4e0);
                    if (!bVar6) {
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                                (&v,&((in_1.
                                       super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_Inst).dest);
                    }
                  }
                  else {
                    iVar7 = (*((ins.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_Displayable)._vptr_Displayable[1])();
                    if (iVar7 == 3) {
                      std::static_pointer_cast<mir::inst::LoadInst,mir::inst::Inst>
                                ((shared_ptr<mir::inst::Inst> *)&in_1);
                      if (((in_1.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->lhs).field_0x18 == '\x01') {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_4f8,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &global);
                        pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)
                                             &((in_1.
                                                super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->lhs).field_0x8);
                        local_700.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_700.id = pvVar15->id;
                        bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)&local_4f8,&local_700);
                        if (bVar6) {
                          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          ~_Vector_base(&local_4f8);
                        }
                        else {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &local_360,&v);
                          pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                              ((variant<int,_mir::inst::VarId> *)
                                               &((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->lhs).field_0x8);
                          local_710.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001d90d0;
                          local_710.id = pvVar15->id;
                          bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            *)&local_360,&local_710);
                          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          ~_Vector_base(&local_360);
                          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          ~_Vector_base(&local_4f8);
                          if (!bVar6) {
                            pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 &((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->lhs).field_0x8);
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
                                      )&global,pvVar15);
                          }
                        }
                      }
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &local_510,
                                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &global);
                      local_720.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001d90d0;
                      local_720.id = ((in_1.
                                       super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_Inst).dest.id;
                      this = &local_510;
                      bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)this,&local_720);
                      if (bVar6) goto LAB_00174641;
                      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 &local_a8,&v);
                      local_730.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001d90d0;
                      local_730.id = ((in_1.
                                       super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_Inst).dest.id;
                      bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)&local_a8,&local_730);
                      std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                      ~_Vector_base(&local_a8);
                      std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                      ~_Vector_base(&local_510);
                      if (!bVar6) {
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                                  (&v,&((in_1.
                                         super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super_Inst).dest);
                      }
                    }
                    else {
                      iVar7 = (*((ins.
                                  super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->super_Displayable)._vptr_Displayable[1])();
                      if (iVar7 == 4) {
                        std::static_pointer_cast<mir::inst::StoreInst,mir::inst::Inst>
                                  ((shared_ptr<mir::inst::Inst> *)&in_1);
                        if (((in_1.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->lhs).field_0x18 == '\x01') {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &local_528,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &global);
                          pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                              ((variant<int,_mir::inst::VarId> *)
                                               &((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->lhs).field_0x8);
                          local_740.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001d90d0;
                          local_740.id = pvVar15->id;
                          bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            *)&local_528,&local_740);
                          if (bVar6) {
                            std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~_Vector_base(&local_528);
                          }
                          else {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)&local_378,&v);
                            pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 &((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->lhs).field_0x8);
                            local_750.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001d90d0;
                            local_750.id = pvVar15->id;
                            bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              *)&local_378,&local_750);
                            std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~_Vector_base(&local_378);
                            std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~_Vector_base(&local_528);
                            if (!bVar6) {
                              pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                                  ((variant<int,_mir::inst::VarId> *)
                                                   &((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->lhs).field_0x8);
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         *)&global,pvVar15);
                            }
                          }
                        }
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_540,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &global);
                        local_760.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_760.id = ((in_1.
                                         super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super_Inst).dest.id;
                        this = &local_540;
                        bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)this,&local_760);
                        if (bVar6) goto LAB_00174641;
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_c0,&v);
                        local_770.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_770.id = ((in_1.
                                         super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super_Inst).dest.id;
                        bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)&local_c0,&local_770);
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_c0);
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_540);
                        if (!bVar6) {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          push_back(&v,&((in_1.
                                          super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_Inst).dest);
                        }
                      }
                      else {
                        iVar7 = (*((ins.
                                    super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->super_Displayable)._vptr_Displayable[1])();
                        if (iVar7 != 5) goto LAB_00174650;
                        std::static_pointer_cast<mir::inst::PtrOffsetInst,mir::inst::Inst>
                                  ((shared_ptr<mir::inst::Inst> *)&in_1);
                        if (((in_1.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->rhs).field_0x8 == '\x01') {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &local_558,
                                     (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &global);
                          pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                              ((variant<int,_mir::inst::VarId> *)
                                               &((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->lhs).field_0x18);
                          local_780.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001d90d0;
                          local_780.id = pvVar15->id;
                          bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            *)&local_558,&local_780);
                          if (bVar6) {
                            std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~_Vector_base(&local_558);
                          }
                          else {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                      ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                        *)&local_390,&v);
                            pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                                ((variant<int,_mir::inst::VarId> *)
                                                 &((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->lhs).field_0x18);
                            local_790.super_Displayable._vptr_Displayable =
                                 (_func_int **)&PTR_display_001d90d0;
                            local_790.id = pvVar15->id;
                            bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                              *)&local_390,&local_790);
                            std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~_Vector_base(&local_390);
                            std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            ~_Vector_base(&local_558);
                            if (!bVar6) {
                              pvVar15 = std::get<1ul,int,mir::inst::VarId>
                                                  ((variant<int,_mir::inst::VarId> *)
                                                   &((in_1.
                                                  super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->lhs).field_0x18);
                              std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                              push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         *)&global,pvVar15);
                            }
                          }
                        }
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_570,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &global);
                        local_7a0.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_7a0.id = *(uint32_t *)
                                        &((in_1.
                                           super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->lhs).field_0x8;
                        bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)&local_570,&local_7a0);
                        if (bVar6) {
                          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          ~_Vector_base(&local_570);
                        }
                        else {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                     &local_d8,&v);
                          local_7b0.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001d90d0;
                          local_7b0.id = *(uint32_t *)
                                          &((in_1.
                                             super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->lhs).field_0x8;
                          bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                            *)&local_d8,&local_7b0);
                          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          ~_Vector_base(&local_d8);
                          std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          ~_Vector_base(&local_570);
                          if (!bVar6) {
                            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                            push_back((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
                                      )&global,(value_type *)
                                               &(in_1.
                                                 super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->lhs);
                          }
                        }
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_588,
                                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &global);
                        local_7c0.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_7c0.id = ((in_1.
                                         super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super_Inst).dest.id;
                        this = &local_588;
                        bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)this,&local_7c0);
                        if (bVar6) goto LAB_00174641;
                        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                   &local_f0,&v);
                        local_7d0.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_7d0.id = ((in_1.
                                         super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super_Inst).dest.id;
                        bVar6 = has_this((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                          *)&local_f0,&local_7d0);
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_f0);
                        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                        ~_Vector_base(&local_588);
                        if (!bVar6) {
                          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                          push_back(&v,&((in_1.
                                          super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_Inst).dest);
                        }
                      }
                    }
                  }
                }
              }
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&in_1.super___shared_ptr<mir::inst::OpInst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            goto LAB_00174650;
          }
          uVar27 = uVar27 + 1;
        }
        pmVar18 = std::
                  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](&def,__k);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=(pmVar18,&v);
        pmVar18 = std::
                  map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                  ::operator[](&use,*(key_type **)(*(long *)(p_Var20 + 1) + uVar26 * 8));
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator=
                  (pmVar18,(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&visit,*(value_type_conflict3 **)(*(long *)(p_Var20 + 1) + uVar26 * 8));
        std::deque<int,_std::allocator<int>_>::push_back
                  (&q.c,*(value_type_conflict3 **)(*(long *)(p_Var20 + 1) + uVar26 * 8));
        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                  ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&global);
        std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
                  (&v.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>);
      }
    }
  } while( true );
}

Assistant:

map<mir::inst::VarId, set<int>> active_var(map<int, BasicBlock*> nodes) {
  map<int, vector<mir::inst::VarId>> def;
  map<int, vector<mir::inst::VarId>> use;
  map<int, vector<mir::inst::VarId>> in;
  map<int, vector<mir::inst::VarId>> out;
  BasicBlock* entry = find_entry(nodes);
  map<int, vector<mir::inst::VarId>>::iterator it;
  // step0: initialization
  map<int, BasicBlock*>::iterator iter;
  for (iter = nodes.begin(); iter != nodes.end(); iter++) {
    vector<mir::inst::VarId> v;
    def.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    use.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    in.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
    out.insert(map<int, vector<mir::inst::VarId>>::value_type(iter->first, v));
  }
  // step1: Find the def and use variables for each block
  // BFS
  vector<int> visit;
  std::queue<int> q;
  visit.push_back(entry->id);
  q.push(entry->id);
  while (!q.empty()) {
    map<int, BasicBlock*>::iterator itt = nodes.find(q.front());
    BasicBlock* p = itt->second;
    q.pop();
    for (int i = 0; i < p->nextBlock.size(); i++) {
      vector<int>::iterator it =
          find(visit.begin(), visit.end(), p->nextBlock[i]->id);
      if (it == visit.end()) {
        vector<mir::inst::VarId> def1;
        vector<mir::inst::VarId> use1;
        for (int j = 0; j < p->nextBlock[i]->inst.size(); j++) {
          if (p->nextBlock[i]->inst[j].index() == 0) {
            shared_ptr<mir::inst::Inst> ins = get<0>(p->nextBlock[i]->inst[j]);
            if (ins->inst_kind() == mir::inst::InstKind::Assign) {
              shared_ptr<mir::inst::AssignInst> in =
                  std::static_pointer_cast<mir::inst::AssignInst>(ins);
              if (in->src.index() == 1) {
                if (!has_this(use1, get<1>(in->src)) &&
                    !has_this(def1, get<1>(in->src))) {
                  mir::inst::VarId s = get<1>(in->src);
                  use1.push_back(s);
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Op) {
              shared_ptr<mir::inst::OpInst> in =
                  std::static_pointer_cast<mir::inst::OpInst>(ins);
              if (in->lhs.index() == 1) {
                if (!has_this(use1, get<1>(in->lhs)) &&
                    !has_this(def1, get<1>(in->lhs))) {
                  use1.push_back(get<1>(in->lhs));
                }
              }
              if (in->rhs.index() == 1) {
                if (!has_this(use1, get<1>(in->rhs)) &&
                    !has_this(def1, get<1>(in->rhs))) {
                  use1.push_back(get<1>(in->rhs));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Call) {
              shared_ptr<mir::inst::CallInst> in =
                  std::static_pointer_cast<mir::inst::CallInst>(ins);
              for (int k = 0; k < in->params.size(); k++) {
                if (in->params[k].index() == 1) {
                  if (!has_this(use1, get<1>(in->params[k])) &&
                      !has_this(def1, get<1>(in->params[k]))) {
                    mir::inst::VarId s = get<1>(in->params[k]);
                    use1.push_back(s);
                  }
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Ref) {
              shared_ptr<mir::inst::RefInst> in =
                  std::static_pointer_cast<mir::inst::RefInst>(ins);
              if (in->val.index() == 0) {
                if (!has_this(use1, get<0>(in->val)) &&
                    !has_this(def1, get<0>(in->val))) {
                  use1.push_back(get<0>(in->val));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Load) {
              shared_ptr<mir::inst::LoadInst> in =
                  std::static_pointer_cast<mir::inst::LoadInst>(ins);
              if (in->src.index() == 1) {
                if (!has_this(use1, get<1>(in->src)) &&
                    !has_this(def1, get<1>(in->src))) {
                  use1.push_back(get<1>(in->src));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::Store) {
              shared_ptr<mir::inst::StoreInst> in =
                  std::static_pointer_cast<mir::inst::StoreInst>(ins);
              if (in->val.index() == 1) {
                if (!has_this(use1, get<1>(in->val)) &&
                    !has_this(def1, get<1>(in->val))) {
                  use1.push_back(get<1>(in->val));
                }
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else if (ins->inst_kind() == mir::inst::InstKind::PtrOffset) {
              shared_ptr<mir::inst::PtrOffsetInst> in =
                  std::static_pointer_cast<mir::inst::PtrOffsetInst>(ins);
              if (in->offset.index() == 1) {
                if (!has_this(use1, get<1>(in->offset)) &&
                    !has_this(def1, get<1>(in->offset))) {
                  use1.push_back(get<1>(in->offset));
                }
              }
              if (!has_this(use1, in->ptr) && !has_this(def1, in->ptr)) {
                use1.push_back(in->ptr);
              }
              if (!has_this(use1, in->dest) && !has_this(def1, in->dest)) {
                def1.push_back(in->dest);
              }
            } else {
              // nothing
            }
          } else if (p->nextBlock[i]->inst[j].index() == 1) {
            shared_ptr<mir::inst::JumpInstruction> ins =
                get<1>(p->nextBlock[i]->inst[j]);
            if (ins->kind == mir::inst::JumpInstructionKind::BrCond ||
                ins->kind == mir::inst::JumpInstructionKind::Return) {
              mir::inst::VarId var;
              if (ins->cond_or_ret && !has_this(use1, *ins->cond_or_ret) &&
                  !has_this(def1, *ins->cond_or_ret)) {
                use1.push_back(*ins->cond_or_ret);
              }
            }
          }
        }
        def[p->nextBlock[i]->id] = def1;
        use[p->nextBlock[i]->id] = use1;
        visit.push_back(p->nextBlock[i]->id);
        q.push(p->nextBlock[i]->id);
      }
    }
  }
  // output for test
  /*for (it = def.begin(); it != def.end(); it++) {
      cout << "def " << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }
  for (it = use.begin(); it != use .end(); it++) {
      cout << "use " << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step2: fill the in and out
  bool flag = true;
  while (flag) {
    flag = false;
    for (iter = nodes.begin(); iter != nodes.end(); iter++) {
      // cout << "|" << iter->second->id << endl;
      vector<mir::inst::VarId> _out = calcu_out(iter->second, in);
      out[iter->first] = _out;
      vector<mir::inst::VarId> _in = calcu_in(iter->first, use, out, def);
      it = in.find(iter->first);
      if (vectors_difference(_in, it->second).size() != 0) {
        flag = true;
        in[iter->first] = _in;
      }
    }
  }
  // output for test
  /*for (it = in.begin(); it != in.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }
  for (it = out.begin(); it != out.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step3: find the global var -- def && out
  map<int, vector<mir::inst::VarId>> global;
  for (it = def.begin(); it != def.end(); it++) {
    map<int, vector<mir::inst::VarId>>::iterator iter = out.find(it->first);
    global.insert(map<int, vector<mir::inst::VarId>>::value_type(
        it->first, vectors_intersection(it->second, iter->second)));
  }
  // output for test
  /*cout << endl << "*** desplay global var ***" << endl;
  for (it = global.begin(); it != global.end(); it++) {
      cout << it->first;
      for (int i = 0; i < it->second.size(); i++) {
          cout << " " << it->second[i];
      }
      cout << endl;
  }*/

  // step4: build the blocks.
  map<mir::inst::VarId, set<int>> blocks;
  // mir::inst::VarId s0(0);
  for (it = global.begin(); it != global.end(); it++) {
    if (it->second.size() > 0) {
      for (int i = 0; i < it->second.size(); i++) {
        // if (it->second[i] != s0) {
        set<int> s = blockHasVar(it->second[i], def, use);
        blocks.insert(
            map<mir::inst::VarId, set<int>>::value_type(it->second[i], s));
        //}
      }
    }
  }
  cout << endl << "*** desplay blocks ***" << endl;
  map<mir::inst::VarId, set<int>>::iterator t;
  for (t = blocks.begin(); t != blocks.end(); t++) {
    cout << t->first;
    set<int>::iterator setit;
    for (setit = t->second.begin(); setit != t->second.end(); setit++) {
      cout << " " << *setit;
    }
    cout << endl;
  }
  return blocks;
}